

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomes.c
# Opt level: O1

int getMutated(int mc,int id)

{
  switch(id) {
  case 1:
    return 0x81;
  case 2:
    return 0x82;
  case 3:
    return 0x83;
  case 4:
    return 0x84;
  case 5:
    return 0x85;
  case 6:
    return 0x86;
  default:
    return -1;
  case 0xc:
    return 0x8c;
  case 0x15:
    return 0x95;
  case 0x17:
    return 0x97;
  case 0x1b:
    return ((mc & 0xfffffffeU) == 0xc) + 0x9b;
  case 0x1c:
    return -(uint)((mc & 0xfffffffeU) == 0xc) | 0x9c;
  case 0x1d:
    return 0x9d;
  case 0x1e:
    return 0x9e;
  case 0x20:
    return 0xa0;
  case 0x21:
    return 0xa1;
  case 0x22:
    return 0xa2;
  case 0x23:
    return 0xa3;
  case 0x24:
    return 0xa4;
  case 0x25:
    return 0xa5;
  case 0x26:
    return 0xa6;
  case 0x27:
    return 0xa7;
  }
}

Assistant:

int getMutated(int mc, int id)
{
    switch (id)
    {
    case plains:                    return sunflower_plains;
    case desert:                    return desert_lakes;
    case mountains:                 return gravelly_mountains;
    case forest:                    return flower_forest;
    case taiga:                     return taiga_mountains;
    case swamp:                     return swamp_hills;
    case snowy_tundra:              return ice_spikes;
    case jungle:                    return modified_jungle;
    case jungle_edge:               return modified_jungle_edge;
    // emulate MC-98995
    case birch_forest:
        return (mc >= MC_1_9 && mc <= MC_1_10) ? tall_birch_hills : tall_birch_forest;
    case birch_forest_hills:
        return (mc >= MC_1_9 && mc <= MC_1_10) ? none : tall_birch_hills;
    case dark_forest:               return dark_forest_hills;
    case snowy_taiga:               return snowy_taiga_mountains;
    case giant_tree_taiga:          return giant_spruce_taiga;
    case giant_tree_taiga_hills:    return giant_spruce_taiga_hills;
    case wooded_mountains:          return modified_gravelly_mountains;
    case savanna:                   return shattered_savanna;
    case savanna_plateau:           return shattered_savanna_plateau;
    case badlands:                  return eroded_badlands;
    case wooded_badlands_plateau:   return modified_wooded_badlands_plateau;
    case badlands_plateau:          return modified_badlands_plateau;
    default:
        return none;
    }
}